

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

void prvTidyWbrToSpace(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  Node *node_00;
  
  if (node != (Node *)0x0) {
    do {
      pNVar1 = node->next;
      if ((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_WBR)) {
        if (node->content != (Node *)0x0) {
          prvTidyWbrToSpace(doc,node->content);
        }
      }
      else {
        node_00 = prvTidyNewLiteralTextNode(doc->lexer," ");
        prvTidyInsertNodeAfterElement(node,node_00);
        prvTidyRemoveNode(node);
        prvTidyFreeNode(doc,node);
      }
      node = pNVar1;
    } while (pNVar1 != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(WbrToSpace)(TidyDocImpl* doc, Node* node)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (nodeIsWBR(node))
        {
            Node* text;
            text = TY_(NewLiteralTextNode)(doc->lexer, " ");
            TY_(InsertNodeAfterElement)(node, text);
            TY_(RemoveNode)(node);
            TY_(FreeNode)(doc, node);
            node = next;
            continue;
        }

        if (node->content)
            TY_(WbrToSpace)(doc, node->content);

        node = next;
   }
}